

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::compiler::SCC_*>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<const_google::protobuf::compiler::SCC_*>_>
::iterator::skip_empty_or_deleted(iterator *this)

{
  uint32_t uVar1;
  ctrl_t *pcVar2;
  GroupSse2Impl local_28;
  
  pcVar2 = this->ctrl_;
  while (*pcVar2 < kSentinel) {
    local_28.ctrl[0] = *(longlong *)pcVar2;
    local_28.ctrl[1] = *(longlong *)(pcVar2 + 8);
    uVar1 = GroupSse2Impl::CountLeadingEmptyOrDeleted(&local_28);
    pcVar2 = this->ctrl_ + uVar1;
    this->ctrl_ = pcVar2;
    (this->field_1).slot_ = (this->field_1).slot_ + uVar1;
  }
  return;
}

Assistant:

void skip_empty_or_deleted() {
      while (IsEmptyOrDeleted(*ctrl_)) {
        uint32_t shift =
            GroupFullEmptyOrDeleted{ctrl_}.CountLeadingEmptyOrDeleted();
        ctrl_ += shift;
        slot_ += shift;
      }
    }